

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O2

char * cmSHA256_End(SHA_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  byte local_28 [32];
  
  if (context != (SHA_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      buffer = (char *)0x0;
      memset(context,0,0xd0);
    }
    else {
      cmSHA256_Final(local_28,context);
      for (lVar2 = 0; (int)lVar2 != 0x20; lVar2 = lVar2 + 1) {
        bVar1 = local_28[lVar2];
        *buffer = "0123456789abcdef"[bVar1 >> 4];
        buffer[1] = "0123456789abcdef"[bVar1 & 0xf];
        buffer = buffer + 2;
      }
      *buffer = '\0';
    }
    return buffer;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cm_sha2.c"
                ,0x455,"char *cmSHA256_End(SHA_CTX *, char *)");
}

Assistant:

char *SHA256_End(SHA_CTX* context, char buffer[]) {
	sha_byte	digest[SHA256_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (buffer != (char*)0) {
		SHA256_Final(digest, context);

		for (i = 0; i < SHA256_DIGEST_LENGTH; i++) {
			*buffer++ = sha_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(*context));
	}
	MEMSET_BZERO(digest, SHA256_DIGEST_LENGTH);
	return buffer;
}